

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint160 * Hash160<XOnlyPubKey>(uint160 *__return_storage_ptr__,XOnlyPubKey *in1)

{
  base_blob<160U> *pbVar1;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  CSHA256 local_88;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = &__return_storage_ptr__->super_base_blob<160U>;
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->super_base_blob<160U>).m_data._M_elems[7] = '\0';
  pbVar1 = &__return_storage_ptr__->super_base_blob<160U>;
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  local_88.buf[0x30] = '\0';
  local_88.buf[0x31] = '\0';
  local_88.buf[0x32] = '\0';
  local_88.buf[0x33] = '\0';
  local_88.buf[0x34] = '\0';
  local_88.buf[0x35] = '\0';
  local_88.buf[0x36] = '\0';
  local_88.buf[0x37] = '\0';
  local_88.buf[0x38] = '\0';
  local_88.buf[0x39] = '\0';
  local_88.buf[0x3a] = '\0';
  local_88.buf[0x3b] = '\0';
  local_88.buf[0x3c] = '\0';
  local_88.buf[0x3d] = '\0';
  local_88.buf[0x3e] = '\0';
  local_88.buf[0x3f] = '\0';
  local_88.buf[0x20] = '\0';
  local_88.buf[0x21] = '\0';
  local_88.buf[0x22] = '\0';
  local_88.buf[0x23] = '\0';
  local_88.buf[0x24] = '\0';
  local_88.buf[0x25] = '\0';
  local_88.buf[0x26] = '\0';
  local_88.buf[0x27] = '\0';
  local_88.buf[0x28] = '\0';
  local_88.buf[0x29] = '\0';
  local_88.buf[0x2a] = '\0';
  local_88.buf[0x2b] = '\0';
  local_88.buf[0x2c] = '\0';
  local_88.buf[0x2d] = '\0';
  local_88.buf[0x2e] = '\0';
  local_88.buf[0x2f] = '\0';
  local_88.buf[0x10] = '\0';
  local_88.buf[0x11] = '\0';
  local_88.buf[0x12] = '\0';
  local_88.buf[0x13] = '\0';
  local_88.buf[0x14] = '\0';
  local_88.buf[0x15] = '\0';
  local_88.buf[0x16] = '\0';
  local_88.buf[0x17] = '\0';
  local_88.buf[0x18] = '\0';
  local_88.buf[0x19] = '\0';
  local_88.buf[0x1a] = '\0';
  local_88.buf[0x1b] = '\0';
  local_88.buf[0x1c] = '\0';
  local_88.buf[0x1d] = '\0';
  local_88.buf[0x1e] = '\0';
  local_88.buf[0x1f] = '\0';
  local_88.buf[0] = '\0';
  local_88.buf[1] = '\0';
  local_88.buf[2] = '\0';
  local_88.buf[3] = '\0';
  local_88.buf[4] = '\0';
  local_88.buf[5] = '\0';
  local_88.buf[6] = '\0';
  local_88.buf[7] = '\0';
  local_88.buf[8] = '\0';
  local_88.buf[9] = '\0';
  local_88.buf[10] = '\0';
  local_88.buf[0xb] = '\0';
  local_88.buf[0xc] = '\0';
  local_88.buf[0xd] = '\0';
  local_88.buf[0xe] = '\0';
  local_88.buf[0xf] = '\0';
  local_88.s[4] = 0;
  local_88.s[5] = 0;
  local_88.s[6] = 0;
  local_88.s[7] = 0;
  local_88.s[0] = 0;
  local_88.s[1] = 0;
  local_88.s[2] = 0;
  local_88.s[3] = 0;
  local_88.bytes = 0;
  CSHA256::CSHA256(&local_88);
  CSHA256::Write(&local_88,(uchar *)in1,0x20);
  output.m_size = 0x14;
  output.m_data = (uchar *)__return_storage_ptr__;
  CHash160::Finalize((CHash160 *)&local_88,output);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline uint160 Hash160(const T1& in1)
{
    uint160 result;
    CHash160().Write(MakeUCharSpan(in1)).Finalize(result);
    return result;
}